

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_NtkFindNamesInPlaces(char *pBuffer,Vec_Int_t *vPlaces,Vec_Ptr_t *vPivots)

{
  char *__needle;
  int iVar1;
  int *piVar2;
  Vec_Ptr_t *vNames;
  void **ppvVar3;
  char *pcVar4;
  char *__s1;
  size_t sVar5;
  char *__dest;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char pLocal [1000];
  ulong local_440;
  char local_418 [1000];
  
  piVar2 = Abc_FrameReadGateCounts();
  vNames = (Vec_Ptr_t *)malloc(0x10);
  vNames->nCap = 100;
  vNames->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNames->pArray = ppvVar3;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  if (1 < vPlaces->nSize) {
    local_440 = 100;
    uVar7 = 0;
    lVar8 = 0;
    do {
      iVar9 = vPlaces->pArray[lVar8 + 1];
      if (((long)iVar9 < 0) || (vPivots->nSize <= iVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = vPlaces->pArray[lVar8];
      __needle = (char *)vPivots->pArray[iVar9];
      lVar6 = 0;
      while (pBuffer[lVar6 + iVar1] != '\n') {
        local_418[lVar6] = pBuffer[lVar6 + iVar1];
        lVar6 = lVar6 + 1;
        if (lVar6 == 1000) {
          __assert_fail("k < 1000",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                        ,0x3c6,"void Acb_NtkFindNamesInPlaces(char *, Vec_Int_t *, Vec_Ptr_t *)");
        }
      }
      local_418[lVar6] = '\0';
      pcVar4 = strstr(local_418,__needle);
      if (pcVar4 == (char *)0x0) {
        printf("Cannot find location of signal \"%s\" in this line.\n",__needle);
      }
      else {
        __s1 = strtok(local_418," \r\n\t,;()");
        if (__s1 != (char *)0x0) {
          iVar9 = 0;
          do {
            iVar1 = strcmp(__s1,"1\'b0");
            if (iVar1 == 0) {
              *piVar2 = *piVar2 + 1;
            }
            else {
              iVar1 = strcmp(__s1,"1\'b1");
              if (iVar1 == 0) {
                piVar2[1] = piVar2[1] + 1;
              }
              else {
                iVar1 = strcmp(__s1,"buf");
                if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"assign"), iVar1 == 0)) {
                  piVar2[2] = piVar2[2] + 1;
                }
                else {
                  iVar1 = strcmp(__s1,"not");
                  if (iVar1 == 0) {
                    piVar2[3] = piVar2[3] + 1;
                  }
                  else {
                    iVar1 = strcmp(__s1,__needle);
                    if ((pcVar4 < __s1) && (iVar1 != 0)) {
                      iVar9 = iVar9 + 1;
                      if ((int)uVar7 < 1) {
                        uVar11 = 0;
LAB_003b0c41:
                        if ((uint)uVar11 != uVar7) goto LAB_003b0c11;
                      }
                      else {
                        ppvVar3 = vNames->pArray;
                        uVar11 = 0;
                        do {
                          iVar1 = strcmp((char *)ppvVar3[uVar11],__s1);
                          if (iVar1 == 0) goto LAB_003b0c41;
                          uVar11 = uVar11 + 1;
                        } while (uVar7 != uVar11);
                      }
                      sVar5 = strlen(__s1);
                      __dest = (char *)malloc(sVar5 + 1);
                      strcpy(__dest,__s1);
                      uVar10 = (uint)local_440;
                      if (uVar7 == uVar10) {
                        if (uVar10 < 0x10) {
                          if (vNames->pArray == (void **)0x0) {
                            ppvVar3 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar3 = (void **)realloc(vNames->pArray,0x80);
                          }
                          vNames->pArray = ppvVar3;
                          vNames->nCap = 0x10;
                          local_440 = 0x10;
                        }
                        else {
                          local_440 = (ulong)(uVar10 * 2);
                          if (vNames->pArray == (void **)0x0) {
                            ppvVar3 = (void **)malloc(local_440 * 8);
                          }
                          else {
                            ppvVar3 = (void **)realloc(vNames->pArray,local_440 * 8);
                          }
                          vNames->pArray = ppvVar3;
                          vNames->nCap = uVar10 * 2;
                        }
                      }
                      else {
                        ppvVar3 = vNames->pArray;
                      }
                      lVar6 = (long)(int)uVar7;
                      uVar7 = uVar7 + 1;
                      vNames->nSize = uVar7;
                      ppvVar3[lVar6] = __dest;
                    }
                  }
                }
              }
            }
LAB_003b0c11:
            __s1 = strtok((char *)0x0," \r\n\t,;()");
          } while (__s1 != (char *)0x0);
          if (1 < iVar9) {
            piVar2[4] = piVar2[4] + iVar9 + -1;
          }
        }
      }
      lVar8 = lVar8 + 2;
    } while ((int)((uint)lVar8 | 1) < vPlaces->nSize);
  }
  Abc_FrameSetSignalNames(vNames);
  return;
}

Assistant:

void Acb_NtkFindNamesInPlaces( char * pBuffer, Vec_Int_t * vPlaces, Vec_Ptr_t * vPivots )
{
    int * pCounts = Abc_FrameReadGateCounts();
    Vec_Ptr_t * vNames = Vec_PtrAlloc( 100 );
    int i, k, iObj, Pos;
    for ( i = 0; i < 5; i++ )
        pCounts[i] = 0;
    Vec_IntForEachEntryDouble( vPlaces, Pos, iObj, i )
    {
        int nFanins = 0;
        char pLocal[1000], * pTemp, * pName, * pSpot;
        char * pPivot = (char *)Vec_PtrEntry(vPivots, iObj);
        for ( k = 0; k < 1000; k++ )
        {
            if ( pBuffer[Pos+k] == '\n' )
            {
                pLocal[k] = 0;
                break;
            }
            else
                pLocal[k] = pBuffer[Pos+k];
        }
        assert( k < 1000 );
        pSpot = strstr( pLocal, pPivot );
        if ( pSpot == NULL )
        {
            printf( "Cannot find location of signal \"%s\" in this line.\n", pPivot );
            continue;
        }
        pTemp = strtok( pLocal, " \r\n\t,;()" );
        while ( pTemp )
        {
            if ( !strcmp(pTemp, "1\'b0") )
                pCounts[0]++;
            else if ( !strcmp(pTemp, "1\'b1") )
                pCounts[1]++;
            else if ( !strcmp(pTemp, "buf") || !strcmp(pTemp, "assign") )
                pCounts[2]++;
            else if ( !strcmp(pTemp, "not") )
                pCounts[3]++;
            else if ( strcmp(pTemp, pPivot) && pTemp > pSpot )
            {
                nFanins++;
                Vec_PtrForEachEntry( char *, vNames, pName, k )
                    if ( !strcmp(pName, pTemp) )
                        break;
                if ( k == Vec_PtrSize(vNames) )
                    Vec_PtrPush( vNames, Abc_UtilStrsav(pTemp) );
            }
            pTemp = strtok( NULL, " \r\n\t,;()" );
        }
        if ( nFanins > 1 )
            pCounts[4] += nFanins-1;
    }
    //printf( "Found %d names\n", Vec_PtrSize(vNames) );
    Abc_FrameSetSignalNames( vNames );
}